

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void test_qclab_dense_memory<double>(void)

{
  bool bVar1;
  type pdVar2;
  char *pcVar3;
  double dVar4;
  AssertHelper local_258;
  Message local_250;
  double local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_11;
  int64_t i_2;
  unique_ptr<double[],_std::default_delete<double[]>_> init10;
  Message local_218;
  double local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_10;
  Message local_1f0;
  double local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_9;
  unique_ptr<double[],_std::default_delete<double[]>_> init2;
  Message local_1c0;
  double local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_8;
  unique_ptr<double[],_std::default_delete<double[]>_> init1;
  Message local_190;
  double local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_7;
  int64_t i_1;
  unique_ptr<double[],_std::default_delete<double[]>_> mem10;
  Message local_158;
  double local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_6;
  Message local_130;
  double local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_5;
  unique_ptr<double[],_std::default_delete<double[]>_> mem2;
  Message local_100;
  double local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_4;
  unique_ptr<double[],_std::default_delete<double[]>_> mem1;
  Message local_d0;
  double local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_3;
  int64_t i;
  unique_ptr<double[],_std::default_delete<double[]>_> alloc10;
  Message local_98;
  double local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  double local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  unique_ptr<double[],_std::default_delete<double[]>_> alloc2;
  Message local_40;
  double local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  unique_ptr<double[],_std::default_delete<double[]>_> local_10;
  unique_ptr<double[],_std::default_delete<double[]>_> alloc1;
  
  qclab::dense::alloc_unique_array<double>((dense *)&local_10,1);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&local_10,0);
  *pdVar2 = 5.0;
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&local_10,0);
  local_38 = 5.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_30,"alloc1[0]","T(5)",pdVar2,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0xb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc2,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc2);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  qclab::dense::alloc_unique_array<double>((dense *)&gtest_ar_1.message_,2);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_1.message_,0
                     );
  *pdVar2 = 5.0;
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_1.message_,1
                     );
  *pdVar2 = 6.0;
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_1.message_,0
                     );
  local_68 = 5.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_60,"alloc2[0]","T(5)",pdVar2,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_1.message_,1
                     );
  local_90 = 6.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_88,"alloc2[1]","T(6)",pdVar2,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc10,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc10);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  qclab::dense::alloc_unique_array<double>((dense *)&i,10);
  for (gtest_ar_3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    dVar4 = (double)(long)gtest_ar_3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)&i,
                        (size_t)gtest_ar_3.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    *pdVar2 = dVar4;
    pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)&i,
                        (size_t)gtest_ar_3.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    local_c8 = (double)(long)gtest_ar_3.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
    testing::internal::EqHelper::Compare<double,_double,_nullptr>
              ((EqHelper *)local_c0,"alloc10[i]","T(i)",pdVar2,&local_c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mem1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x16,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mem1,&local_d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem1);
      testing::Message::~Message(&local_d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  }
  qclab::dense::init_unique_array<double>((dense *)&gtest_ar_4.message_,1);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_4.message_,0
                     );
  local_f8 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_f0,"mem1[0]","T(0)",pdVar2,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem2,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem2);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  qclab::dense::init_unique_array<double>((dense *)&gtest_ar_5.message_,2);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_5.message_,0
                     );
  local_128 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_120,"mem2[0]","T(0)",pdVar2,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_5.message_,1
                     );
  local_150 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_148,"mem2[1]","T(0)",pdVar2,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem10,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem10);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  qclab::dense::init_unique_array<double>((dense *)&i_1,10);
  for (gtest_ar_7.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_7.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)&i_1,
                        (size_t)gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    local_188 = 0.0;
    testing::internal::EqHelper::Compare<double,_double,_nullptr>
              ((EqHelper *)local_180,"mem10[i]","T(0)",pdVar2,&local_188);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&init1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x23,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&init1,&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init1);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  }
  qclab::dense::init_unique_array<double>((dense *)&gtest_ar_8.message_,1,3.14);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_8.message_,0
                     );
  local_1b8 = 3.14;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1b0,"init1[0]","T(3.14)",pdVar2,&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init2,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init2);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  qclab::dense::init_unique_array<double>((dense *)&gtest_ar_9.message_,2,3.14);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_9.message_,0
                     );
  local_1e8 = 3.14;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1e0,"init2[0]","T(3.14)",pdVar2,&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_9.message_,1
                     );
  local_210 = 3.14;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_208,"init2[1]","T(3.14)",pdVar2,&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init10,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init10);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  qclab::dense::init_unique_array<double>((dense *)&i_2,10,3.14);
  for (gtest_ar_11.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_11.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_11.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       ((unique_ptr<double[],_std::default_delete<double[]>_> *)&i_2,
                        (size_t)gtest_ar_11.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    local_248 = 3.14;
    testing::internal::EqHelper::Compare<double,_double,_nullptr>
              ((EqHelper *)local_240,"init10[i]","T(3.14)",pdVar2,&local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x30,pcVar3);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  }
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&i_2);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_9.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_8.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&i_1);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_5.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_4.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&i);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&gtest_ar_1.message_);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_10);
  return;
}

Assistant:

void test_qclab_dense_memory() {

  // alloc_unique_array
  std::unique_ptr< T[] >  alloc1 = qclab::dense::alloc_unique_array< T >( 1 ) ;
  alloc1[0] = T(5) ;
  EXPECT_EQ( alloc1[0] , T(5) ) ;

  std::unique_ptr< T[] >  alloc2 = qclab::dense::alloc_unique_array< T >( 2 ) ;
  alloc2[0] = T(5) ;
  alloc2[1] = T(6) ;
  EXPECT_EQ( alloc2[0] , T(5) ) ;
  EXPECT_EQ( alloc2[1] , T(6) ) ;

  std::unique_ptr< T[] >  alloc10 = qclab::dense::alloc_unique_array< T >( 10 );
  for ( int64_t i = 0; i < 1; i++ ) {
    alloc10[i] = T(i) ;
    EXPECT_EQ( alloc10[i] , T(i) ) ;
  }

  // init_unique_array (zero)
  std::unique_ptr< T[] >  mem1 = qclab::dense::init_unique_array< T >( 1 ) ;
  EXPECT_EQ( mem1[0] , T(0) ) ;

  std::unique_ptr< T[] >  mem2 = qclab::dense::init_unique_array< T >( 2 ) ;
  EXPECT_EQ( mem2[0] , T(0) ) ;
  EXPECT_EQ( mem2[1] , T(0) ) ;

  std::unique_ptr< T[] >  mem10 = qclab::dense::init_unique_array< T >( 10 ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( mem10[i] , T(0) ) ;
  }

  // init_unique_array (zero)
  auto init1 = qclab::dense::init_unique_array< T >( 1 , T(3.14) ) ;
  EXPECT_EQ( init1[0] , T(3.14) ) ;

  auto init2 = qclab::dense::init_unique_array< T >( 2 , T(3.14) ) ;
  EXPECT_EQ( init2[0] , T(3.14) ) ;
  EXPECT_EQ( init2[1] , T(3.14) ) ;

  auto init10 = qclab::dense::init_unique_array< T >( 10 , T(3.14) ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( init10[i] , T(3.14) ) ;
  }

}